

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::InternalDeallocate<false>
          (RepeatedField<unsigned_long> *this)

{
  int iVar1;
  string *psVar2;
  void *ptr;
  RepeatedField<float> *this_00;
  uint size;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong in_RSI;
  LongSooRep *pLVar7;
  SooRep *this_01;
  SooRep *this_02;
  Arena *this_03;
  Arena *pAStack_c0;
  long lStack_b8;
  SooRep *pSStack_b0;
  Arena aAStack_a8 [16];
  LongSooRep *pLStack_98;
  SooRep *pSStack_90;
  ulong uStack_88;
  SooRep SStack_78;
  ulong uStack_68;
  code *pcStack_60;
  LongSooRep LStack_58;
  SooRep SStack_28;
  LongSooRep local_10;
  
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0) {
    SStack_28.field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x146892;
    InternalDeallocate<false>(this);
    return;
  }
  pLVar7 = &local_10;
  SStack_28.field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x1468a1;
  InternalDeallocate<false>((RepeatedField<unsigned_long> *)pLVar7);
  if ((pLVar7->elements_int & 4) != 0) {
    internal::LongSooRep::elements(pLVar7);
    return;
  }
  this_01 = &SStack_28;
  heap_rep();
  pLVar7 = &LStack_58;
  uVar4 = in_RSI & 0xffffffff;
  iVar6 = 1;
  if ((int)in_RSI == 0) {
    iVar6 = (this_01->field_0).long_rep.capacity;
  }
  if (iVar6 < (int)size) {
    pcStack_60 = (code *)0x146913;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)(int)size,(long)iVar6,"size <= Capacity(is_soo)");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    internal::SooRep::set_size(this_01,SUB81(uVar4,0),size);
    return;
  }
  pcStack_60 = RepeatedField<float>::elements;
  set_size();
  uVar5 = (ulong)psVar2 & 0xffffffff;
  iVar6 = 2;
  if ((int)psVar2 == 0) {
    iVar6 = pLVar7->capacity;
  }
  uStack_68 = (ulong)size;
  pcStack_60 = (code *)uVar4;
  if (iVar6 < 1) {
    uStack_88 = 0x146974;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar6,0,"Capacity(is_soo) > 0");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    if ((char)uVar5 != '\0') {
      return;
    }
    internal::LongSooRep::elements(pLVar7);
    return;
  }
  this_02 = &SStack_78;
  uStack_88 = 0x146983;
  RepeatedField<float>::elements();
  this_03 = aAStack_a8;
  iVar6 = (int)psVar2;
  lVar3 = (long)iVar6;
  pLStack_98 = pLVar7;
  pSStack_90 = this_01;
  uStack_88 = uVar5;
  if (iVar6 < 0) {
    pSStack_b0 = (SooRep *)0x1469ec;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>(lVar3,0,"index >= 0");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    pSStack_b0 = (SooRep *)0x1469b1;
    iVar1 = internal::SooRep::size
                      (this_02,(undefined1  [16])
                               ((undefined1  [16])this_02->field_0 & (undefined1  [16])0x4) ==
                               (undefined1  [16])0x0);
    if (iVar6 < iVar1) {
      psVar2 = (string *)0x0;
    }
    else {
      pSStack_b0 = (SooRep *)0x146a00;
      psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (lVar3,(long)iVar1,"index < size()");
    }
    if (psVar2 == (string *)0x0) {
      pSStack_b0 = (SooRep *)0x1469ce;
      RepeatedField<float>::elements
                ((RepeatedField<float> *)this_02,
                 (undefined1  [16])((undefined1  [16])this_02->field_0 & (undefined1  [16])0x4) ==
                 (undefined1  [16])0x0);
      return;
    }
  }
  else {
    pSStack_b0 = (SooRep *)0x146a0d;
    RepeatedField<float>::Mutable();
  }
  pSStack_b0 = (SooRep *)Arena::CreateArenaCompatible<google::protobuf::RepeatedField<float>>;
  RepeatedField<float>::Mutable();
  lStack_b8 = lVar3;
  pSStack_b0 = this_02;
  if (this_03 == (Arena *)0x0) {
    this_00 = (RepeatedField<float> *)operator_new(0x10);
    RepeatedField<float>::RepeatedField(this_00,(Arena *)0x0);
  }
  else {
    ptr = Arena::Allocate(this_03,0x10);
    pAStack_c0 = this_03;
    Arena::InternalHelper<google::protobuf::RepeatedField<float>>::
    Construct<google::protobuf::Arena*>(ptr,&pAStack_c0);
  }
  return;
}

Assistant:

void InternalDeallocate() {
    ABSL_DCHECK(!is_soo());
    const size_t bytes = Capacity(false) * sizeof(Element) + kHeapRepHeaderSize;
    if (heap_rep()->arena == nullptr) {
      internal::SizedDelete(heap_rep(), bytes);
    } else if (!in_destructor) {
      // If we are in the destructor, we might be being destroyed as part of
      // the arena teardown. We can't try and return blocks to the arena then.
      heap_rep()->arena->ReturnArrayMemory(heap_rep(), bytes);
    }
  }